

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

size_t __thiscall
trieste::PassDef::apply_special<false,true,false>(PassDef *this,Node *root,Match *match)

{
  PassDef *pPVar1;
  _Base_ptr __x;
  type *this_00;
  iterator this_01;
  bool bVar2;
  element_type *peVar3;
  Token *pTVar4;
  type *__lhs;
  pointer ppVar5;
  unsigned_long uVar6;
  __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_02;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *this_03;
  reference this_04;
  reference pvVar7;
  anon_class_24_3_cc5efcb3 remove;
  anon_class_16_2_fa368570 add;
  size_t changes;
  Match *match_local;
  Node *root_local;
  PassDef *this_local;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_1e8;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_1e0;
  shared_ptr<trieste::NodeDef> *local_1d0;
  _Base_ptr local_1c8;
  Node *curr;
  type *local_1b8;
  type *it;
  shared_ptr<trieste::NodeDef> *node;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_1a0;
  pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
  local_198;
  undefined1 local_188 [8];
  vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
  path;
  undefined1 local_160 [8];
  Node root_1;
  shared_ptr<trieste::NodeDef> local_128;
  _Self local_118;
  _Self local_110;
  iterator pre_f_1;
  shared_ptr<trieste::NodeDef> local_e8;
  _Self local_d8;
  _Self local_d0;
  iterator pre_f;
  pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
  *rule;
  iterator __end3;
  iterator __begin3;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *__range3;
  vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
  *specific_rules;
  iterator start;
  ptrdiff_t replaced;
  __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
  local_48;
  iterator it_1;
  DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
  *rules;
  size_t changes_1;
  
  add.changes = (size_t *)0x0;
  add.this = (PassDef *)&add.changes;
  root_1.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
       operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                  )root);
  pPVar1 = add.this;
  std::enable_shared_from_this<trieste::NodeDef>::shared_from_this
            ((enable_shared_from_this<trieste::NodeDef> *)local_160);
  pre_f._M_node = (_Base_ptr)local_160;
  peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_160);
  pTVar4 = NodeDef::type(peVar3);
  bVar2 = Token::operator&(pTVar4,0x40);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)pre_f._M_node);
    pTVar4 = NodeDef::type(peVar3);
    local_d0._M_node =
         (_Base_ptr)
         CLI::std::
         map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
         ::find((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                 *)&this->pre_,pTVar4);
    local_d8._M_node =
         (_Base_ptr)
         CLI::std::
         map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
         ::end((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                *)&this->pre_);
    bVar2 = CLI::std::operator==(&local_d0,&local_d8);
    if (((bVar2 ^ 0xffU) & 1) != 0) {
      ppVar5 = CLI::std::
               _Rb_tree_iterator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>
               ::operator->(&local_d0);
      std::shared_ptr<trieste::NodeDef>::shared_ptr
                (&local_e8,(shared_ptr<trieste::NodeDef> *)pre_f._M_node);
      uVar6 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::operator()
                        ((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                         &ppVar5->second,&local_e8);
      (pPVar1->name_)._M_dataplus._M_p = (pPVar1->name_)._M_dataplus._M_p + uVar6;
      std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_e8);
    }
    bVar2 = true;
  }
  if (bVar2) {
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::vector((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
              *)local_188);
    peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_160);
    local_1a0._M_current = (shared_ptr<trieste::NodeDef> *)NodeDef::begin(peVar3);
    std::
    pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
    ::
    pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,_true>
              (&local_198,(shared_ptr<trieste::NodeDef> *)local_160,&local_1a0);
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::push_back((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                 *)local_188,&local_198);
    while (bVar2 = std::
                   vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                   ::empty((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                            *)local_188), ((bVar2 ^ 0xffU) & 1) != 0) {
      node = (shared_ptr<trieste::NodeDef> *)
             std::
             vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
             ::back((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                     *)local_188);
      it = (type *)std::
                   get<0ul,std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>
                             ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                               *)node);
      __lhs = std::
              get<1ul,std::shared_ptr<trieste::NodeDef>&,__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>*,std::vector<std::shared_ptr<trieste::NodeDef>,std::allocator<std::shared_ptr<trieste::NodeDef>>>>>
                        ((pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
                          *)node);
      local_1b8 = __lhs;
      peVar3 = std::__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)it);
      curr = (Node *)NodeDef::end(peVar3);
      bVar2 = __gnu_cxx::
              operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                        (__lhs,(__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                *)&curr);
      this_00 = it;
      if (((bVar2 ^ 0xffU) & 1) == 0) {
        peVar3 = std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)it);
        pTVar4 = NodeDef::type(peVar3);
        it_1._M_current =
             (shared_ptr<trieste::NodeDef> *)
             detail::
             DefaultMap<trieste::detail::DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>_>
             ::get(&this->rule_map,pTVar4);
        bVar2 = detail::
                DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                ::empty((DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                         *)it_1._M_current);
        if (!bVar2) {
          peVar3 = std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)this_00);
          local_48._M_current = (shared_ptr<trieste::NodeDef> *)NodeDef::begin(peVar3);
          while( true ) {
            peVar3 = std::
                     __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)this_00);
            replaced = (ptrdiff_t)NodeDef::end(peVar3);
            bVar2 = __gnu_cxx::
                    operator==<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                              (&local_48,
                               (__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                                *)&replaced);
            this_01 = it_1;
            if (((bVar2 ^ 0xffU) & 1) == 0) break;
            start._M_current = (shared_ptr<trieste::NodeDef> *)0xffffffffffffffff;
            specific_rules =
                 (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                  *)local_48._M_current;
            this_02 = (__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)__gnu_cxx::
                         __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                         ::operator*(&local_48);
            peVar3 = std::
                     __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(this_02);
            pTVar4 = NodeDef::type(peVar3);
            this_03 = (vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                       *)detail::
                         DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                         ::get((DefaultMap<std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                                *)this_01._M_current,pTVar4);
            __end3 = CLI::std::
                     vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                     ::begin(this_03);
            rule = (pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>
                    *)CLI::std::
                      vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>
                      ::end(this_03);
            while (bVar2 = __gnu_cxx::
                           operator==<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                                     (&__end3,(__normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                                               *)&rule), ((bVar2 ^ 0xffU) & 1) != 0) {
              this_04 = __gnu_cxx::
                        __normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
                        ::operator*(&__end3);
              match->index = 0;
              pvVar7 = std::
                       vector<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                       ::operator[]((vector<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>,_std::allocator<std::pair<bool,_std::map<trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>_>_>_>_>
                                     *)&match->captures,0);
              pvVar7->first = false;
              bVar2 = detail::Pattern::match((Pattern *)this_04,&local_48,(Node *)this_00,match);
              if (((bVar2) &&
                  (bVar2 = range_contains_error((NodeIt)specific_rules,(NodeIt)local_48._M_current),
                  ((bVar2 ^ 0xffU) & 1) != 0)) &&
                 (start._M_current =
                       (shared_ptr<trieste::NodeDef> *)
                       replace(this,match,&this_04->second,(NodeIt *)&specific_rules,&local_48,
                               (Node *)this_00),
                 start._M_current != (shared_ptr<trieste::NodeDef> *)0xffffffffffffffff)) break;
              local_48._M_current = (shared_ptr<trieste::NodeDef> *)specific_rules;
              __gnu_cxx::
              __normal_iterator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_*,_std::vector<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>,_std::allocator<std::pair<trieste::detail::Located<trieste::detail::Pattern>,_std::function<std::shared_ptr<trieste::NodeDef>_(trieste::Match_&)>_>_>_>_>
              ::operator++(&__end3);
            }
            if (start._M_current == (shared_ptr<trieste::NodeDef> *)0xffffffffffffffff) {
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
              ::operator++(&local_48);
            }
            else {
              bVar2 = flag(this,4);
              if (bVar2) {
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                ::operator+=(&local_48,(difference_type)start._M_current);
              }
              else {
                peVar3 = std::
                         __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)this_00);
                local_48._M_current = (shared_ptr<trieste::NodeDef> *)NodeDef::begin(peVar3);
              }
            }
          }
        }
        std::
        vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
        ::pop_back((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                    *)local_188);
      }
      else {
        local_1c8 = (_Base_ptr)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                    ::operator*(local_1b8);
        local_1d0 = (shared_ptr<trieste::NodeDef> *)
                    __gnu_cxx::
                    __normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>
                    ::operator++(local_1b8,0);
        pre_f_1._M_node = local_1c8;
        peVar3 = std::
                 __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1c8);
        pTVar4 = NodeDef::type(peVar3);
        bVar2 = Token::operator&(pTVar4,0x40);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          peVar3 = std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)pre_f_1._M_node);
          pTVar4 = NodeDef::type(peVar3);
          local_110._M_node =
               (_Base_ptr)
               CLI::std::
               map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
               ::find((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                       *)&this->pre_,pTVar4);
          local_118._M_node =
               (_Base_ptr)
               CLI::std::
               map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
               ::end((map<trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>,_std::less<trieste::Token>,_std::allocator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>_>
                      *)&this->pre_);
          bVar2 = CLI::std::operator==(&local_110,&local_118);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            ppVar5 = CLI::std::
                     _Rb_tree_iterator<std::pair<const_trieste::Token,_std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>_>_>
                     ::operator->(&local_110);
            std::shared_ptr<trieste::NodeDef>::shared_ptr
                      (&local_128,(shared_ptr<trieste::NodeDef> *)pre_f_1._M_node);
            uVar6 = CLI::std::function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)>::
                    operator()((function<unsigned_long_(std::shared_ptr<trieste::NodeDef>)> *)
                               &ppVar5->second,&local_128);
            (pPVar1->name_)._M_dataplus._M_p = (pPVar1->name_)._M_dataplus._M_p + uVar6;
            std::shared_ptr<trieste::NodeDef>::~shared_ptr(&local_128);
          }
          bVar2 = true;
        }
        __x = local_1c8;
        if (bVar2) {
          peVar3 = std::
                   __shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_1c8);
          local_1e8._M_current = (shared_ptr<trieste::NodeDef> *)NodeDef::begin(peVar3);
          std::
          pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>
          ::
          pair<__gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>,_true>
                    (&local_1e0,(shared_ptr<trieste::NodeDef> *)__x,&local_1e8);
          std::
          vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
          ::push_back((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
                       *)local_188,&local_1e0);
        }
      }
    }
    std::
    vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ::~vector((vector<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
               *)local_188);
    path.
    super__Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  }
  else {
    path.
    super__Vector_base<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>,_std::allocator<std::pair<std::shared_ptr<trieste::NodeDef>_&,___gnu_cxx::__normal_iterator<std::shared_ptr<trieste::NodeDef>_*,_std::vector<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::shared_ptr<trieste::NodeDef>::~shared_ptr((shared_ptr<trieste::NodeDef> *)local_160);
  return (size_t)add.changes;
}

Assistant:

size_t apply_special(Node root, Match& match)
    {
      size_t changes = 0;

      auto add = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        // Don't examine Error or Lift nodes.
        if (node->type() & flag::internal)
          return false;

        if constexpr (Pre)
        {
          auto pre_f = pre_.find(node->type());
          if (pre_f != pre_.end())
            changes += pre_f->second(node);
        }
        if constexpr (Topdown)
          changes += match_children(node, match);

        return true;
      };

      auto remove = [&](Node& node) SNMALLOC_FAST_PATH_LAMBDA {
        if constexpr (!Topdown)
          changes += match_children(node, match);
        else
          snmalloc::UNUSED(node);
        if constexpr (Post)
        {
          auto post_f = post_.find(node->type());
          if (post_f != post_.end())
            changes += post_f->second(node);
        }
      };

      root->traverse(add, remove);

      return changes;
    }